

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5DlidxLvlNext(Fts5DlidxLvl *pLvl)

{
  Fts5Data *pFVar1;
  u8 *puVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  u8 *puVar6;
  int iVar7;
  long lVar8;
  long in_FS_OFFSET;
  u64 iVal;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar1 = pLvl->pData;
  iVar4 = pLvl->iOff;
  lVar8 = (long)iVar4;
  if (lVar8 == 0) {
    pLvl->iOff = 1;
    iVar4 = sqlite3Fts5GetVarint32(pFVar1->p + 1,(u32 *)&pLvl->iLeafPgno);
    lVar8 = (long)iVar4 + (long)pLvl->iOff;
    pLvl->iOff = (int)lVar8;
    bVar3 = sqlite3Fts5GetVarint(pFVar1->p + lVar8,(u64 *)&pLvl->iRowid);
    iVar4 = (uint)bVar3 + pLvl->iOff;
    pLvl->iOff = iVar4;
    pLvl->iFirstOff = iVar4;
  }
  else {
    if (iVar4 < pFVar1->nn) {
      puVar2 = pFVar1->p;
      lVar5 = lVar8 << 0x20;
      puVar6 = puVar2 + lVar8;
      iVar7 = 0;
      do {
        if (*puVar6 != '\0') {
          local_30 = &DAT_aaaaaaaaaaaaaaaa;
          pLvl->iLeafPgno = (pLvl->iLeafPgno - iVar7) + 1;
          bVar3 = sqlite3Fts5GetVarint(puVar2 + (lVar5 >> 0x20),(u64 *)&local_30);
          pLvl->iRowid = (i64)(local_30 + pLvl->iRowid);
          pLvl->iOff = ((uint)bVar3 + iVar4) - iVar7;
          goto LAB_001e07de;
        }
        lVar5 = lVar5 + 0x100000000;
        iVar7 = iVar7 + -1;
        puVar6 = puVar6 + 1;
      } while (iVar4 - pFVar1->nn != iVar7);
    }
    pLvl->bEof = 1;
  }
LAB_001e07de:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pLvl->bEof;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5DlidxLvlNext(Fts5DlidxLvl *pLvl){
  Fts5Data *pData = pLvl->pData;

  if( pLvl->iOff==0 ){
    assert( pLvl->bEof==0 );
    pLvl->iOff = 1;
    pLvl->iOff += fts5GetVarint32(&pData->p[1], pLvl->iLeafPgno);
    pLvl->iOff += fts5GetVarint(&pData->p[pLvl->iOff], (u64*)&pLvl->iRowid);
    pLvl->iFirstOff = pLvl->iOff;
  }else{
    int iOff;
    for(iOff=pLvl->iOff; iOff<pData->nn; iOff++){
      if( pData->p[iOff] ) break;
    }

    if( iOff<pData->nn ){
      u64 iVal;
      pLvl->iLeafPgno += (iOff - pLvl->iOff) + 1;
      iOff += fts5GetVarint(&pData->p[iOff], &iVal);
      pLvl->iRowid += iVal;
      pLvl->iOff = iOff;
    }else{
      pLvl->bEof = 1;
    }
  }

  return pLvl->bEof;
}